

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int alpn_cb(SSL *s,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  int iVar1;
  
  iVar1 = SSL_select_next_proto(out,outlen,(uchar *)arg,(uint)*(byte *)((long)arg + 0x17),in,inlen);
  return (uint)(iVar1 != 1) * 3;
}

Assistant:

static int
alpn_cb(SSL *s, const unsigned char **out, unsigned char *outlen,
	const unsigned char *in, unsigned int inlen, void *arg)
{
#if !defined(LWS_WITH_MBEDTLS)
	struct alpn_ctx *alpn_ctx = (struct alpn_ctx *)arg;

	if (SSL_select_next_proto((unsigned char **)out, outlen, alpn_ctx->data,
				  alpn_ctx->len, in, inlen) !=
	    OPENSSL_NPN_NEGOTIATED)
		return SSL_TLSEXT_ERR_NOACK;
#endif

	return SSL_TLSEXT_ERR_OK;
}